

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::flip_x
          (image<crnlib::color_quad<unsigned_char,_int>_> *this)

{
  uint uVar1;
  color_quad<unsigned_char,_int> *pcVar2;
  color_quad<unsigned_char,_int> *this_00;
  color_quad<unsigned_char,_int> local_20;
  uint local_1c;
  color_quad<unsigned_char,_int> c;
  uint x;
  uint y;
  uint half_width;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_local;
  
  uVar1 = this->m_width;
  for (c.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                   (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                    )0x0; (uint)c.field_0 < this->m_height;
      c.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)((int)c.field_0 + 1)
      ) {
    for (local_1c = 0; local_1c < uVar1 >> 1; local_1c = local_1c + 1) {
      pcVar2 = operator()(this,local_1c,(uint)c.field_0);
      color_quad<unsigned_char,_int>::color_quad(&local_20,pcVar2);
      pcVar2 = operator()(this,(this->m_width - 1) - local_1c,(uint)c.field_0);
      this_00 = operator()(this,local_1c,(uint)c.field_0);
      color_quad<unsigned_char,_int>::operator=(this_00,pcVar2);
      pcVar2 = operator()(this,(this->m_width - 1) - local_1c,(uint)c.field_0);
      color_quad<unsigned_char,_int>::operator=(pcVar2,&local_20);
    }
  }
  return;
}

Assistant:

void flip_x()
        {
            const uint half_width = m_width / 2;
            for (uint y = 0; y < m_height; y++)
            {
                for (uint x = 0; x < half_width; x++)
                {
                    color_type c((*this)(x, y));
                    (*this)(x, y) = (*this)(m_width - 1 - x, y);
                    (*this)(m_width - 1 - x, y) = c;
                }
            }
        }